

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O3

ElnDist * __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::CalculateUpperLimit
          (ElnDist *__return_storage_ptr__,ElectronOptimisationAlgorithm *this)

{
  pointer puVar1;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *p_Var2;
  Score SVar3;
  uint uVar4;
  const_iterator __position;
  size_type sVar5;
  _Rb_tree_node_base *p_Var6;
  ElectronOptimisationAlgorithm *this_00;
  ulong uVar7;
  pointer puVar8;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar9;
  size_t mPos;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> all_pos;
  _Alloc_node local_c0;
  Score local_b4;
  ElectronOptimisationAlgorithm *local_b0;
  unsigned_long local_a8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_a0;
  ElnDist local_70;
  ElnDist local_50;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->m_bits,&(this->previousDist_).m_bits);
  sVar5 = (this->previousDist_).m_num_bits;
  __return_storage_ptr__->m_num_bits = sVar5;
  puVar8 = (__return_storage_ptr__->m_bits).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (__return_storage_ptr__->m_bits).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_b0 = this;
  if (puVar8 != puVar1) {
    memset(puVar8,0,(long)puVar1 - (long)puVar8 & 0xfffffffffffffff8);
    sVar5 = __return_storage_ptr__->m_num_bits;
  }
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (sVar5 != 0) {
    __position._M_node = &local_a0._M_impl.super__Rb_tree_header._M_header;
    do {
      local_c0._M_t = &local_a0;
      __position._M_node =
           (_Base_ptr)
           std::
           _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
           ::
           _M_insert_unique_<unsigned_long_const&,std::_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>::_Alloc_node>
                     ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                       *)&local_a0,__position,&local_a8,&local_c0);
      local_a8 = local_a8 + 1;
    } while (local_a8 < __return_storage_ptr__->m_num_bits);
  }
  sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                    (__return_storage_ptr__);
  this_00 = local_b0;
  if (sVar5 < local_b0->parent_->electronsToAdd_) {
    do {
      local_b4 = Options::AssignElectrons::INF;
      local_c0._M_t =
           *(_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             **)(local_a0._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      puVar8 = (__return_storage_ptr__->m_bits).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      p_Var6 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_a0._M_impl.super__Rb_tree_header) {
        do {
          p_Var2 = *(_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     **)(p_Var6 + 1);
          uVar7 = 1L << ((byte)p_Var2 & 0x3f);
          puVar8[(ulong)p_Var2 >> 6] = puVar8[(ulong)p_Var2 >> 6] | uVar7;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_50.m_bits,&__return_storage_ptr__->m_bits);
          local_50.m_num_bits = __return_storage_ptr__->m_num_bits;
          SVar3 = CalculateDistributionEnergy(local_b0,&local_50);
          if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_50.m_bits.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_50.m_bits.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (SVar3 < local_b4) {
            local_c0._M_t =
                 (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)p_Var2;
            local_b4 = SVar3;
          }
          puVar8 = (__return_storage_ptr__->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar8[(ulong)p_Var2 >> 6] = puVar8[(ulong)p_Var2 >> 6] & ~uVar7;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          this_00 = local_b0;
        } while ((_Rb_tree_header *)p_Var6 != &local_a0._M_impl.super__Rb_tree_header);
      }
      puVar8[(ulong)local_c0._M_t >> 6] =
           puVar8[(ulong)local_c0._M_t >> 6] | 1L << ((byte)local_c0._M_t & 0x3f);
      pVar9 = std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::equal_range(&local_a0,(key_type *)&local_c0);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux(&local_a0,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
      sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                        (__return_storage_ptr__);
    } while (sVar5 < this_00->parent_->electronsToAdd_);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_70.m_bits,&__return_storage_ptr__->m_bits);
  local_70.m_num_bits = __return_storage_ptr__->m_num_bits;
  uVar4 = CalculateDistributionEnergy(this_00,&local_70);
  this_00->upperLimit_ = uVar4;
  if (local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar4 = this_00->upperLimit_;
  }
  if (uVar4 < Options::AssignElectrons::INF) {
    this_00->upperLimit_ = uVar4 + 1;
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

ElnDist ElectronOptimisationAlgorithm::CalculateUpperLimit() {
//  bool tmp_allow_charged_carbon = opt_::ALLOW_CHARGED_CARBON;
//  opt_::ALLOW_CHARGED_CARBON = true;
//  uint32_t tmp_high_charge = opt_::HIGHEST_MAGNITUDE_CHARGE;
//  opt_::HIGHEST_MAGNITUDE_CHARGE = 0;
  
  ElnDist initDist = ElnDist(previousDist_);
  initDist.reset();
  std::set<size_t> all_pos;
  std::set<size_t>::const_iterator it = all_pos.begin();
  for (size_t i = 0; i < initDist.size(); ++i) it = all_pos.insert(it, i);
  
  while (initDist.count() < parent_->electronsToAdd_) {
    Score cMin = opt_::INF;
    size_t mPos = *(all_pos.begin());
    for (size_t i : all_pos) {
      initDist.set(i);
      Score tmp = CalculateDistributionEnergy(initDist);
      if (tmp < cMin) {
        cMin = tmp;
        mPos = i;
      }
      initDist.reset(i);
    }
    initDist.set(mPos);
    all_pos.erase(mPos);
  }
  upperLimit_ = CalculateDistributionEnergy(initDist);
  
//  opt_::ALLOW_CHARGED_CARBON = tmp_allow_charged_carbon;
//  opt_::HIGHEST_MAGNITUDE_CHARGE = tmp_high_charge;
  
  if (upperLimit_ < opt_::INF) ++upperLimit_;
  return initDist;
}